

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O0

Raster * rw::Raster::createFromImage(Image *image,int32 platform)

{
  bool32 bVar1;
  int32 local_38;
  int32 local_34;
  int32 format;
  int32 depth;
  int32 height;
  int32 width;
  Raster *raster;
  Image *pIStack_18;
  int32 platform_local;
  Image *image_local;
  
  raster._4_4_ = platform;
  pIStack_18 = image;
  bVar1 = imageFindRasterFormat(image,4,&depth,&format,&local_34,&local_38,platform);
  if (bVar1 == 0) {
    image_local = (Image *)0x0;
  }
  else {
    _height = create(depth,format,local_34,local_38,raster._4_4_);
    if (_height == (Raster *)0x0) {
      image_local = (Image *)0x0;
    }
    else {
      image_local = (Image *)setFromImage(_height,pIStack_18,raster._4_4_);
    }
  }
  return (Raster *)image_local;
}

Assistant:

Raster*
Raster::createFromImage(Image *image, int32 platform)
{
	Raster *raster;
	int32 width, height, depth, format;
	if(!imageFindRasterFormat(image, TEXTURE, &width, &height, &depth, &format, platform))
		return nil;
	raster = Raster::create(width, height, depth, format, platform);
	if(raster == nil)
		return nil;
	return raster->setFromImage(image, platform);
}